

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::MapCacheIdsToPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  undefined1 this_00 [8];
  NodeBase *this_01;
  bool bVar2;
  uint rootObjectLoadInlineCacheStart_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint isInstInlineCacheCount;
  anon_class_8_1_13edd398_for_fn fn;
  undefined4 *puVar6;
  Type_conflict pSVar7;
  Type *pTVar8;
  anon_class_16_2_ecaa615f_for_fn fn_00;
  anon_class_16_2_9003bde0_for_fn fn_01;
  anon_class_16_2_0040d76a_for_fn fn_02;
  undefined1 local_a8 [8];
  Iterator toStringIter;
  Iterator valueOfIter;
  uint totalFieldAccessInlineCacheCount;
  uint rootObjectStoreInlineCacheStart;
  uint rootObjectLoadMethodInlineCacheStart;
  uint rootObjectLoadInlineCacheStart;
  FunctionBody *functionBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  fn.functionBody = FuncInfo::GetParsedFunctionBody(funcInfo);
  rootObjectLoadInlineCacheStart_00 = FuncInfo::GetInlineCacheCount(funcInfo);
  uVar3 = FuncInfo::GetRootObjectLoadInlineCacheCount(funcInfo);
  uVar3 = rootObjectLoadInlineCacheStart_00 + uVar3;
  uVar4 = FuncInfo::GetRootObjectLoadMethodInlineCacheCount(funcInfo);
  uVar4 = uVar3 + uVar4;
  uVar5 = FuncInfo::GetRootObjectStoreInlineCacheCount(funcInfo);
  isInstInlineCacheCount = FuncInfo::GetIsInstInlineCacheCount(funcInfo);
  Js::FunctionBody::CreateCacheIdToPropertyIdMap
            (fn.functionBody,rootObjectLoadInlineCacheStart_00,uVar3,uVar4,uVar4 + uVar5,
             isInstInlineCacheCount);
  if (uVar4 + uVar5 != 0) {
    JsUtil::
    BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo*)::__0>
              ((BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->inlineCacheMap,fn);
    fn_00.rootObjectLoadInlineCacheStart = rootObjectLoadInlineCacheStart_00;
    fn_00.functionBody = fn.functionBody;
    fn_00._12_4_ = 0;
    JsUtil::
    BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo*)::__1>
              ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->rootObjectLoadInlineCacheMap,fn_00);
    fn_01.rootObjectLoadMethodInlineCacheStart = uVar3;
    fn_01.functionBody = fn.functionBody;
    fn_01._12_4_ = 0;
    JsUtil::
    BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo*)::__2>
              ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->rootObjectLoadMethodInlineCacheMap,fn_01);
    fn_02.rootObjectStoreInlineCacheStart = uVar4;
    fn_02.functionBody = fn.functionBody;
    fn_02._12_4_ = 0;
    JsUtil::
    BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo*)::__3>
              ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->rootObjectStoreInlineCacheMap,fn_02);
    SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&toStringIter.current,&funcInfo->valueOfStoreCacheIds);
    while( true ) {
      if (valueOfIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_01 = toStringIter.current;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)this_01,
                         pSVar7);
      if (bVar2) break;
      valueOfIter.list =
           (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
           SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      pTVar8 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&toStringIter.current);
      Js::FunctionBody::SetPropertyIdForCacheId(fn.functionBody,*pTVar8,0x18e);
    }
    SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)local_a8,&funcInfo->toStringStoreCacheIds);
    while( true ) {
      if (toStringIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = local_a8;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(toStringIter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)this_00,
                         pSVar7);
      if (bVar2) break;
      toStringIter.list =
           (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
           SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(toStringIter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      pTVar8 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_a8);
      Js::FunctionBody::SetPropertyIdForCacheId(fn.functionBody,*pTVar8,0x178);
    }
    toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
    Js::FunctionBody::VerifyCacheIdToPropertyIdMap(fn.functionBody);
  }
  return;
}

Assistant:

void ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo *funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint rootObjectLoadInlineCacheStart = funcInfo->GetInlineCacheCount();
    uint rootObjectLoadMethodInlineCacheStart = rootObjectLoadInlineCacheStart + funcInfo->GetRootObjectLoadInlineCacheCount();
    uint rootObjectStoreInlineCacheStart = rootObjectLoadMethodInlineCacheStart + funcInfo->GetRootObjectLoadMethodInlineCacheCount();
    uint totalFieldAccessInlineCacheCount = rootObjectStoreInlineCacheStart + funcInfo->GetRootObjectStoreInlineCacheCount();

    functionBody->CreateCacheIdToPropertyIdMap(rootObjectLoadInlineCacheStart, rootObjectLoadMethodInlineCacheStart,
        rootObjectStoreInlineCacheStart, totalFieldAccessInlineCacheCount, funcInfo->GetIsInstInlineCacheCount());

    if (totalFieldAccessInlineCacheCount == 0)
    {
        return;
    }

    funcInfo->inlineCacheMap->Map([functionBody](Js::RegSlot regSlot, FuncInfo::InlineCacheIdMap *inlineCacheIdMap)
    {
        inlineCacheIdMap->Map([functionBody](Js::PropertyId propertyId, FuncInfo::InlineCacheList* inlineCacheList)
        {
            if (inlineCacheList)
            {
                inlineCacheList->Iterate([functionBody, propertyId](InlineCacheUnit cacheUnit)
                {
                    CompileAssert(offsetof(InlineCacheUnit, cacheId) == offsetof(InlineCacheUnit, loadCacheId));
                    if (cacheUnit.loadCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadCacheId, propertyId);
                    }
                    if (cacheUnit.loadMethodCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadMethodCacheId, propertyId);
                    }
                    if (cacheUnit.storeCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.storeCacheId, propertyId);
                    }
                });
            }
        });
    });

    funcInfo->rootObjectLoadInlineCacheMap->Map([functionBody, rootObjectLoadInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectLoadMethodInlineCacheMap->Map([functionBody, rootObjectLoadMethodInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadMethodInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectStoreInlineCacheMap->Map([functionBody, rootObjectStoreInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectStoreInlineCacheStart, propertyId);
    });

    SListBase<uint>::Iterator valueOfIter(&funcInfo->valueOfStoreCacheIds);
    while (valueOfIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(valueOfIter.Data(), Js::PropertyIds::valueOf);
    }

    SListBase<uint>::Iterator toStringIter(&funcInfo->toStringStoreCacheIds);
    while (toStringIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(toStringIter.Data(), Js::PropertyIds::toString);
    }

#if DBG
    functionBody->VerifyCacheIdToPropertyIdMap();
#endif
}